

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> * __thiscall
MXNetNode::weight(MXNetNode *this,int i,int init_len)

{
  vector<MXNetNode,_std::allocator<MXNetNode>_> *this_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference this_01;
  ulong uVar8;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  MXNetParam *p;
  int j;
  string *node_name;
  vector<float,_std::allocator<float>_> *data;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  int iVar9;
  undefined4 in_stack_ffffffffffffff90;
  int iVar10;
  vector<float,_std::allocator<float>_> *__x;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  int local_24;
  
  __x = in_RDI;
  if ((in_EDX < 0) ||
     (iVar10 = in_EDX,
     sVar6 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x17)), (int)sVar6 <= iVar10)
     ) {
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x1193c9);
  }
  else {
    this_00 = (vector<MXNetNode,_std::allocator<MXNetNode>_> *)*in_RSI;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x17),(long)in_EDX);
    std::vector<MXNetNode,_std::allocator<MXNetNode>_>::operator[](this_00,(long)*pvVar7);
    local_24 = 0;
    while (iVar9 = local_24,
          sVar6 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::size
                            ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RSI[1]),
          iVar9 < (int)sVar6) {
      this_01 = std::vector<MXNetParam,_std::allocator<MXNetParam>_>::operator[]
                          ((vector<MXNetParam,_std::allocator<MXNetParam>_> *)in_RSI[1],
                           (long)local_24);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(iVar9,CONCAT13(in_stack_ffffffffffffff83,
                                                      CONCAT12(in_stack_ffffffffffffff82,
                                                               CONCAT11(in_stack_ffffffffffffff81,
                                                                        in_stack_ffffffffffffff80)))
                                      ),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff7f,
                                       CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)
                                      ));
      if (!bVar1) {
        bVar1 = std::vector<float,_std::allocator<float>_>::empty
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(iVar10,in_stack_ffffffffffffff90));
        if (!bVar1) {
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)this_01,
                     (vector<float,_std::allocator<float>_> *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
          return __x;
        }
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)0x11949a);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          return __x;
        }
        if (in_ECX == 0) {
          return __x;
        }
        uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(iVar9,CONCAT13(in_stack_ffffffffffffff83,
                                                         CONCAT12(in_stack_ffffffffffffff82,
                                                                  CONCAT11(in_stack_ffffffffffffff81
                                                                           ,
                                                  in_stack_ffffffffffffff80)))),
                                (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                                 CONCAT16(in_stack_ffffffffffffff7e,
                                                          in_stack_ffffffffffffff78)));
        if (((!(bool)uVar2) &&
            (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(iVar9,CONCAT13(uVar2,CONCAT12(
                                                  in_stack_ffffffffffffff82,
                                                  CONCAT11(in_stack_ffffffffffffff81,
                                                           in_stack_ffffffffffffff80)))),
                                     (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                                      CONCAT16(in_stack_ffffffffffffff7e,
                                                               in_stack_ffffffffffffff78))),
            !(bool)uVar3)) &&
           (uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(iVar9,CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                                    (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                                     CONCAT16(in_stack_ffffffffffffff7e,
                                                              in_stack_ffffffffffffff78))),
           !(bool)uVar4)) {
          uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(iVar9,CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4,
                                                  in_stack_ffffffffffffff80)))),
                                  (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                                   CONCAT16(in_stack_ffffffffffffff7e,
                                                            in_stack_ffffffffffffff78)));
          if (((!(bool)uVar5) &&
              (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(iVar9,CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(
                                                  uVar4,uVar5)))),
                                       (char *)CONCAT17(in_stack_ffffffffffffff7f,
                                                        CONCAT16(in_stack_ffffffffffffff7e,
                                                                 in_stack_ffffffffffffff78))),
              !bVar1)) &&
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(iVar9,CONCAT13(uVar2,CONCAT12(uVar3,CONCAT11(uVar4
                                                  ,uVar5)))),
                                      (char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                                      in_stack_ffffffffffffff78))),
             !bVar1)) {
            return __x;
          }
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(0x3f800000,in_stack_ffffffffffffffb0),(size_type)in_RSI,
                     (value_type_conflict1 *)__x);
          return __x;
        }
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(size_type)in_RSI,
                   (value_type_conflict1 *)__x);
        return __x;
      }
      local_24 = local_24 + 1;
    }
    memset(in_RDI,0,0x18);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x119640);
  }
  return __x;
}

Assistant:

std::vector<float> MXNetNode::weight(int i, int init_len) const
{
    if (i < 0 || i >= (int)weights.size())
        return std::vector<float>();

    const std::string& node_name = (*nodes)[weights[i]].name;

    for (int j = 0; j < (int)(*params).size(); j++)
    {
        const MXNetParam& p = (*params)[j];
        if (p.name != node_name)
            continue;

        if (!p.data.empty())
            return p.data;

        std::vector<float> data;

        if (!p.init.empty() && init_len != 0)
        {
            if (p.init == "[\\$zero\\$, {}]" || p.init == "[\\\"zero\\\", {}]" || p.init == "zeros")
            {
                data.resize(init_len, 0.f);
            }
            else if (p.init == "[\\$one\\$, {}]" || p.init == "[\\\"one\\\", {}]" || p.init == "ones")
            {
                data.resize(init_len, 1.f);
            }
        }

        return data;
    }

    return std::vector<float>();
}